

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_radio_interface.c
# Opt level: O0

void dlep_radio_interface_cleanup(void)

{
  list_entity *plVar1;
  list_entity *plVar2;
  avl_tree *paVar3;
  list_entity *__tempptr_3;
  list_entity *__tempptr_2;
  list_entity *__tempptr_1;
  list_entity *__tempptr;
  dlep_radio_if *it;
  dlep_radio_if *interf;
  
  paVar3 = dlep_if_get_tree(true);
  plVar1 = (paVar3->list_head).next;
  it = (dlep_radio_if *)(plVar1 + -0xb5);
  plVar1 = plVar1->next;
  while( true ) {
    __tempptr = plVar1 + -0xb5;
    plVar2 = (it->interf)._node.list.prev;
    paVar3 = dlep_if_get_tree(true);
    if (plVar2 == (paVar3->list_head).prev) break;
    dlep_radio_remove_interface(it);
    it = (dlep_radio_if *)__tempptr;
    plVar1 = plVar1->next;
  }
  oonf_class_remove(&_interface_class);
  dlep_radio_session_cleanup();
  dlep_extension_cleanup();
  return;
}

Assistant:

void
dlep_radio_interface_cleanup(void) {
  struct dlep_radio_if *interf, *it;

  avl_for_each_element_safe(dlep_if_get_tree(true), interf, interf._node, it) {
    dlep_radio_remove_interface(interf);
  }

  oonf_class_remove(&_interface_class);
  dlep_radio_session_cleanup();
  dlep_extension_cleanup();
}